

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O1

err_t bignParamsGen(bign_params *params,bign_pgen_calc_q calc_q,bign_pgen_on_seed on_seed,
                   void *state)

{
  octet *buf2;
  octet *buf;
  octet *src;
  u64 *dest;
  u64 *dest_00;
  u64 *dest_01;
  u64 *dest_02;
  bool_t bVar1;
  int iVar2;
  err_t eVar3;
  size_t pos;
  size_t sVar4;
  u64 *dest_03;
  u64 *state_00;
  long lVar5;
  ulong uVar6;
  size_t count;
  void *stack;
  ulong count_00;
  ulong n;
  
  bVar1 = memIsValid(params,0x150);
  eVar3 = 0x6d;
  if ((calc_q != (bign_pgen_calc_q)0x0) && (bVar1 != 0)) {
    sVar4 = params->l;
    eVar3 = 0x1f6;
    if (((sVar4 == 0x80) || ((sVar4 == 0x100 || (sVar4 == 0xc0)))) && ((~params->p[0] & 3) == 0)) {
      count_00 = sVar4 * 2 + 7 >> 3;
      buf2 = params->p;
      if ((char)buf2[count_00 - 1] < '\0') {
        buf = params->a;
        bVar1 = memIsZero(buf,count_00);
        if ((bVar1 == 0) && (iVar2 = memCmpRev(buf,buf2,count_00), iVar2 < 0)) {
          count = 0x40 - count_00;
          bVar1 = memIsZero(buf2 + count_00,count);
          if ((bVar1 != 0) && (bVar1 = memIsZero(buf + count_00,count), bVar1 != 0)) {
            n = sVar4 * 2 + 0x3f >> 6;
            sVar4 = bignParamsGen_deep(n);
            dest_03 = (u64 *)blobCreate(sVar4);
            if (dest_03 == (u64 *)0x0) {
              eVar3 = 0x6e;
            }
            else {
              dest = dest_03 + n;
              dest_00 = dest + n;
              dest_01 = dest_00 + n;
              dest_02 = dest_01 + n;
              sVar4 = beltHash_keep();
              stack = (void *)((long)dest_02 + sVar4 + 8);
              u64From(dest_03,buf2,count_00);
              bVar1 = priIsPrime(dest_03,n,stack);
              if (bVar1 == 0) {
                eVar3 = 0x1f6;
              }
              else {
                state_00 = dest_01 + n + 1;
                u64From(dest,buf,count_00);
                src = params->seed;
                memCopy(dest_02,src,8);
                do {
                  do {
                    do {
                      memCopy(src,dest_02,8);
                      if ((on_seed != (bign_pgen_on_seed)0x0) &&
                         (eVar3 = (*on_seed)(params,state), eVar3 != 0)) goto LAB_0012263c;
                      beltHashStart(state_00);
                      beltHashStepH(buf2,count_00,state_00);
                      beltHashStepH(buf,count_00,state_00);
                      sVar4 = beltHash_keep();
                      memCopy(stack,state_00,sVar4);
                      beltHashStepH(src,8,state_00);
                      uVar6 = 1;
                      lVar5 = 0;
                      do {
                        uVar6 = *(byte *)((long)dest_02 + lVar5) + uVar6;
                        *(char *)((long)dest_02 + lVar5) = (char)uVar6;
                        uVar6 = uVar6 >> 8;
                        lVar5 = lVar5 + 1;
                      } while (lVar5 != 8);
                      beltHashStepH(dest_02,8,stack);
                      beltHashStepG((octet *)dest_00,state_00);
                      beltHashStepG((octet *)(dest_00 + 4),stack);
                      u64From(dest_00,dest_00,0x40);
                      zzMod(dest_00,dest_00,8,dest_03,n,stack);
                      bVar1 = ecpDetIsZero(dest,dest_00,dest_03,n,stack);
                    } while ((bVar1 != 0) ||
                            (iVar2 = zzJacobi(dest_00,n,dest_03,n,stack), iVar2 != 1));
                    u64To(params->b,count_00,dest_00);
                    memSet(params->b + count_00,'\0',count);
                    eVar3 = (*calc_q)(params,state);
                  } while (eVar3 == 0x76);
                  if (eVar3 != 0) goto LAB_0012263c;
                  u64From(dest_01,params->q,count_00);
                  sVar4 = wwBitSize(dest_01,n);
                } while ((((sVar4 != params->l * 2) || (bVar1 = wwEq(dest_01,dest_03,n), bVar1 != 0)
                          ) || (bVar1 = priIsPrime(dest_01,n,stack), bVar1 == 0)) ||
                        (bVar1 = ecpMOVIsMet(dest_01,dest_03,n,0x32,stack), bVar1 == 0));
                eVar3 = 0;
                memSet(params->q + count_00,'\0',count);
                wwCopy(dest,dest_03,n);
                zzAddW2(dest,n,1);
                wwShLo(dest,n,2);
                zzPowerMod(dest_01,dest_00,n,dest,n,dest_03,stack);
                u64To(params->yG,count_00,dest_01);
                memSet(params->yG + count_00,'\0',count);
              }
LAB_0012263c:
              blobClose(dest_03);
            }
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bignParamsGen(bign_params* params, bign_pgen_calc_q calc_q,
	bign_pgen_on_seed on_seed, void* state)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* st;
	word* p;				/* [n] */
	word* a;				/* [n] */
	word* b;				/* [W_OF_B(512)] B / [n] b */
	word* q;				/* [n] */
	word* yG;				/* [n] */
	octet* seed;			/* [8] */
	octet* hash_state;		/* [beltHash_keep] */
	void* stack;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) || 
		!calc_q)
		return ERR_BAD_INPUT;
	// проверить уровень стойкости
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	// размерности
	no = O_OF_B(2 * params->l);
	n = W_OF_B(2 * params->l);
	// проверить params:
	// - p -- 2l-битовое число?
	// - p mod 4 == 3?
	// - 0 < a < p?
	// - неиспользуемые октеты p и a обнулены?
	if (params->p[0] % 4 != 3 || params->p[no - 1] < 128 ||
		memIsZero(params->a, no) ||
		memCmpRev(params->a, params->p, no) >= 0 ||
		!memIsZero(params->p + no, sizeof(params->p) - no) ||
		!memIsZero(params->a + no, sizeof(params->a) - no))
		return ERR_BAD_PARAMS;
	// создать состояние
	st = blobCreate(bignParamsGen_deep(n));
	if (st == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	p = (word*)st;
	a = p + n;
	b = a + n;
	q = yG = b + n;
	seed = (octet*)(q + n);
	hash_state = seed + 8;
	stack = hash_state + beltHash_keep();
	ASSERT((octet*)b + 64 <= seed);
	// загрузить и проверить p
	wwFrom(p, params->p, no);
	ASSERT(wwBitSize(p, n) == params->l * 2);
	ASSERT(wwGetBits(p, 0, 2) == 3);
	if (!priIsPrime(p, n, stack))
	{
		blobClose(st);
		return ERR_BAD_PARAMS;
	}
	// загрузить a
	wwFrom(a, params->a, no);
	ASSERT(!wwIsZero(a, n));
	ASSERT(wwCmp(a, p, n) < 0);
	// загрузить seed
	memCopy(seed, params->seed, 8);
	// цикл генерации
	while (1)
	{
		// обработать seed
		memCopy(params->seed, seed, 8);
		if (on_seed)
		{
			code = on_seed(params, state);
			ERR_CALL_HANDLE(code, blobClose(st));
		}
		// belt-hash(p || a ||..)
		beltHashStart(hash_state);
		beltHashStepH(params->p, no, hash_state);
		beltHashStepH(params->a, no, hash_state);
		memCopy(stack, hash_state, beltHash_keep());
		// belt-hash(..seed)
		beltHashStepH(params->seed, 8, hash_state);
		// belt-hash(..seed + 1)
		bignSeedInc(seed);
		beltHashStepH(seed, 8, stack);
		// B <- belt-hash(p || a || seed) || belt-hash(p || a || seed + 1)
		beltHashStepG((octet*)b, hash_state);
		beltHashStepG((octet*)b + 32, stack);
		// b <- B \mod p
		wwFrom(b, b, 64);
		zzMod(b, b, W_OF_O(64), p, n, stack);
		// проверить b
		if (ecpDetIsZero(a, b, p, n, stack) ||
			zzJacobi(b, n, p, n, stack) != 1)
			continue;
		// сохранить b
		wwTo(params->b, no, b);
		memSetZero(params->b + no, sizeof(params->b) - no);
		// вычиcлить q
		code = calc_q(params, state);
		if (code == ERR_NO_RESULT)
			continue;
		ERR_CALL_HANDLE(code, blobClose(st));
		// загрузить и проверить q
		wwFrom(q, params->q, no);
		if (wwBitSize(q, n) == params->l * 2 &&
			!wwEq(q, p, n) &&
			priIsPrime(q, n, stack) &&
			ecpMOVIsMet(q, p, n, 50, stack))
			break;
	}
	// сохранить q
	memSetZero(params->q + no, sizeof(params->q) - no);
	// вычислить yG = b^{(p + 1) / 4} mod p
	wwCopy(a, p, n);
	zzAddW2(a, n, 1);
	ASSERT(!wwIsZero(a, n));
	wwShLo(a, n, 2);
	zzPowerMod(yG, b, n, a, n, p, stack);
	// сохранить yG
	wwTo(params->yG, no, yG);
	memSetZero(params->yG + no, sizeof(params->yG) - no);
	// завершение
	blobClose(st);
	return code;
}